

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QMimeType>::end(QList<QMimeType> *this)

{
  QMimeType *n;
  QArrayDataPointer<QMimeType> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<QMimeType> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QMimeType> *)0x8ec1a9);
  QArrayDataPointer<QMimeType>::operator->(in_RDI);
  n = QArrayDataPointer<QMimeType>::end(in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }